

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O3

BOOL find_dupname_details
               (PCRE2_SPTR16 name,uint32_t length,int *indexptr,int *countptr,int *errorcodeptr,
               compile_block_16 *cb)

{
  ushort uVar1;
  ulong len;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  PCRE2_SPTR16 str2;
  ushort *puVar7;
  
  if (cb->names_found != 0) {
    puVar7 = cb->name_table;
    len = (ulong)length;
    uVar6 = 0;
    do {
      iVar2 = _pcre2_strncmp_16(name,puVar7 + 1,len);
      if ((iVar2 == 0) && (puVar7[length + 1] == 0)) {
        uVar1 = cb->names_found;
        break;
      }
      puVar7 = puVar7 + cb->name_entry_size;
      uVar6 = uVar6 + 1;
      uVar1 = cb->names_found;
    } while (uVar6 < uVar1);
    if (uVar6 < uVar1) {
      *indexptr = uVar6;
      iVar2 = 1;
      do {
        iVar3 = iVar2;
        uVar5 = 1 << ((byte)*puVar7 & 0x1f);
        uVar4 = (uint)*puVar7;
        if (0x1f < uVar4) {
          uVar5 = 1;
        }
        cb->backref_map = cb->backref_map | uVar5;
        if (cb->top_backref < uVar4) {
          cb->top_backref = uVar4;
        }
        if ((uint)cb->names_found <= iVar3 + uVar6) break;
        uVar1 = cb->name_entry_size;
        str2 = puVar7 + (ulong)uVar1 + 1;
        iVar2 = _pcre2_strncmp_16(name,str2,len);
        if (iVar2 != 0) break;
        puVar7 = puVar7 + uVar1;
        iVar2 = iVar3 + 1;
      } while (str2[len] == 0);
      *countptr = iVar3;
      return 1;
    }
  }
  *errorcodeptr = 0x99;
  cb->erroroffset = (long)name - (long)cb->start_pattern >> 1;
  return 0;
}

Assistant:

static BOOL
find_dupname_details(PCRE2_SPTR name, uint32_t length, int *indexptr,
  int *countptr, int *errorcodeptr, compile_block *cb)
{
uint32_t i, groupnumber;
int count;
PCRE2_UCHAR *slot = cb->name_table;

/* Find the first entry in the table */

for (i = 0; i < cb->names_found; i++)
  {
  if (PRIV(strncmp)(name, slot+IMM2_SIZE, length) == 0 &&
      slot[IMM2_SIZE+length] == 0) break;
  slot += cb->name_entry_size;
  }

/* This should not occur, because this function is called only when we know we
have duplicate names. Give an internal error. */

if (i >= cb->names_found)
  {
  *errorcodeptr = ERR53;
  cb->erroroffset = name - cb->start_pattern;
  return FALSE;
  }

/* Record the index and then see how many duplicates there are, updating the
backref map and maximum back reference as we do. */

*indexptr = i;
count = 0;

for (;;)
  {
  count++;
  groupnumber = GET2(slot,0);
  cb->backref_map |= (groupnumber < 32)? (1u << groupnumber) : 1;
  if (groupnumber > cb->top_backref) cb->top_backref = groupnumber;
  if (++i >= cb->names_found) break;
  slot += cb->name_entry_size;
  if (PRIV(strncmp)(name, slot+IMM2_SIZE, length) != 0 ||
    (slot+IMM2_SIZE)[length] != 0) break;
  }

*countptr = count;
return TRUE;
}